

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall
duckdb::DBConfig::DBConfig(DBConfig *this,case_insensitive_map_t<Value> *config_dict,bool read_only)

{
  undefined7 in_register_00000011;
  _Hash_node_base *p_Var1;
  
  DBConfig(this);
  if ((int)CONCAT71(in_register_00000011,read_only) != 0) {
    (this->options).access_mode = READ_ONLY;
  }
  for (p_Var1 = (config_dict->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    SetOptionByName(this,(string *)(p_Var1 + 1),(Value *)(p_Var1 + 5));
  }
  return;
}

Assistant:

DBConfig::DBConfig(const case_insensitive_map_t<Value> &config_dict, bool read_only) : DBConfig::DBConfig(read_only) {
	SetOptionsByName(config_dict);
}